

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Anchor * AddAnchor(TidyDocImpl *doc,ctmbstr name,Node *node)

{
  Anchor *pAVar1;
  int iVar2;
  uint uVar3;
  _Anchor *p_Var4;
  tmbstr ptVar5;
  Anchor *pAVar6;
  
  p_Var4 = (_Anchor *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
  ptVar5 = prvTidytmbstrdup(doc->allocator,name);
  p_Var4->name = ptVar5;
  ptVar5 = prvTidytmbstrtolower(ptVar5);
  p_Var4->name = ptVar5;
  p_Var4->node = node;
  p_Var4->next = (_Anchor *)0x0;
  iVar2 = prvTidyHTMLVersion(doc);
  if (iVar2 == 0x20000) {
    uVar3 = anchorNameHash5(name);
  }
  else {
    uVar3 = anchorNameHash(name);
  }
  pAVar1 = (doc->attribs).anchor_hash[uVar3];
  if (pAVar1 == (Anchor *)0x0) {
    pAVar6 = (Anchor *)((doc->attribs).anchor_hash + uVar3);
  }
  else {
    do {
      pAVar6 = pAVar1;
      pAVar1 = pAVar6->next;
    } while (pAVar6->next != (_Anchor *)0x0);
  }
  pAVar6->next = p_Var4;
  return (Anchor *)0x0;
}

Assistant:

static Anchor* AddAnchor( TidyDocImpl* doc, ctmbstr name, Node *node )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *a = NewAnchor( doc, name, node );
    uint h;
    if (TY_(HTMLVersion)(doc) == HT50)
        h = anchorNameHash5(name);
    else
        h = anchorNameHash(name);

    if ( attribs->anchor_hash[h] == NULL)
         attribs->anchor_hash[h] = a;
    else
    {
        Anchor *here =  attribs->anchor_hash[h];
        while (here->next)
            here = here->next;
        here->next = a;
    }

    return attribs->anchor_hash[h];
}